

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

String * __thiscall
kj::InputStream::readAllText(String *__return_storage_ptr__,InputStream *this,uint64_t limit)

{
  size_t sVar1;
  uchar *puVar2;
  Array<unsigned_char> local_48;
  Array<char> result;
  
  anon_unknown_74::readAll(&local_48,this,limit,true);
  sVar1 = local_48.size_;
  puVar2 = local_48.ptr;
  if (local_48.disposer == (ArrayDisposer *)0x0) {
    result.disposer = (ArrayDisposer *)0x0;
    sVar1 = 0;
    puVar2 = (uchar *)0x0;
  }
  else {
    result.disposer = local_48.disposer;
    local_48.ptr = (uchar *)0x0;
    local_48.size_ = 0;
  }
  (__return_storage_ptr__->content).ptr = (char *)puVar2;
  (__return_storage_ptr__->content).size_ = sVar1;
  (__return_storage_ptr__->content).disposer = local_48.disposer;
  result.ptr = (char *)0x0;
  result.size_ = 0;
  Array<char>::~Array(&result);
  Array<unsigned_char>::~Array(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String InputStream::readAllText(uint64_t limit) {
  return String(readAll(*this, limit, true).releaseAsChars());
}